

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O1

wchar_t curses_display_objects
                  (nh_objitem_conflict *items,wchar_t icount,char *title,wchar_t how,
                  nh_objresult_conflict *results)

{
  bool bVar1;
  bool bVar2;
  wchar_t wVar3;
  uint uVar4;
  gamewin *gw;
  WINDOW *pWVar5;
  _func_void_gamewin_ptr *p_Var6;
  undefined4 extraout_var;
  char *pcVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  nh_bool *pnVar13;
  char cVar14;
  int iVar15;
  code *pcVar16;
  uint uVar17;
  long lVar18;
  wchar_t wVar19;
  long lVar20;
  nh_objitem_conflict *pnVar21;
  wchar_t *pwVar22;
  ulong uVar23;
  wchar_t ccount;
  nh_objitem_conflict *local_218;
  nh_menuitem_conflict *local_210;
  long local_208;
  long local_200;
  undefined8 local_1f8;
  undefined4 local_1f0;
  nh_cmd_arg local_1ec;
  wchar_t selected [1];
  char title_1 [128];
  char sbuf [256];
  
  local_1f0 = curs_set(0);
  gw = alloc_gamewin(L'H');
  gw->draw = draw_objmenu;
  gw->resize = resize_objmenu;
  gw[1].resize = (_func_void_gamewin_ptr *)items;
  *(wchar_t *)&gw[1].prev = icount;
  gw[1].next = (gamewin *)title;
  *(wchar_t *)((long)&gw[1].prev + 4) = how;
  *(undefined4 *)((long)&gw[2].draw + 4) = 0xffffffff;
  local_218 = items;
  pWVar5 = (WINDOW *)calloc((long)icount,4);
  gw[1].win = pWVar5;
  if (((uint)(how + L'\xffffffff') < 0xfffffffe) && (iVar11 = *(int *)&gw[1].prev, 0 < (long)iVar11)
     ) {
    p_Var6 = gw[1].resize;
    cVar14 = 'a';
    lVar12 = 0;
    do {
      if (((p_Var6[lVar12 + 0x120] == (_func_void_gamewin_ptr)0x0) &&
          (*(int *)(p_Var6 + lVar12 + 0x104) == 1)) && (*(int *)(p_Var6 + lVar12 + 0x100) != 0)) {
        p_Var6[lVar12 + 0x120] = (_func_void_gamewin_ptr)cVar14;
        if (cVar14 == 'z') {
          cVar14 = 'A';
        }
        else if (cVar14 == 'Z') {
          cVar14 = 'a';
        }
        else {
          cVar14 = cVar14 + '\x01';
        }
      }
      lVar12 = lVar12 + 0x124;
    } while ((long)iVar11 * 0x124 - lVar12 != 0);
  }
  layout_objmenu(gw);
  iVar11 = *(int *)((long)&gw[2].win + 4);
  pWVar5 = (WINDOW *)
           newwin(*(int *)&gw[2].resize,iVar11,(_LINES - *(int *)&gw[2].resize) / 2,
                  (_COLS - iVar11) / 2);
  gw->win = pWVar5;
  keypad(pWVar5,1);
  nh_box_wborder((WINDOW_conflict *)gw->win,0x600);
  p_Var6 = (_func_void_gamewin_ptr *)
           derwin(gw->win,*(undefined4 *)&gw[2].win,*(undefined4 *)&gw[2].next,
                  *(int *)((long)&gw[2].resize + 4) + -1,2);
  gw[1].draw = p_Var6;
  leaveok(gw->win,1);
  leaveok(gw[1].draw);
  uVar23 = (ulong)(uint)icount;
  local_1f8 = 0;
  bVar2 = false;
  bVar1 = false;
  pnVar21 = local_218;
  do {
    draw_objmenu(gw);
    wVar3 = nh_wgetch(gw->win);
    if (wVar3 < L'^') {
      if (wVar3 < L'.') {
        if (wVar3 < L' ') {
          if (wVar3 == L'\r') goto LAB_0010e03d;
          if (wVar3 != L'\x1b') goto switchD_0010d8a9_caseD_104;
          local_1f8 = CONCAT71((int7)(CONCAT44(extraout_var,wVar3) >> 8),1);
        }
        else {
          if (wVar3 == L' ') goto switchD_0010d926_caseD_3e;
          if (wVar3 == L',') {
            if (*(int *)((long)&gw[1].prev + 4) == 2) {
              wVar3 = *(wchar_t *)&gw[2].draw;
              lVar12 = (long)wVar3;
              if (wVar3 < icount) {
                lVar18 = lVar12 * 0x49 + 0x44;
                iVar11 = icount - wVar3;
                do {
                  if ((long)*(int *)&gw[2].win + (long)*(int *)&gw[2].draw <= lVar12) break;
                  if (*(int *)(gw[1].resize + lVar18 * 4) != -1) {
                    ((gw[1].win)->_bkgrnd).chars[lVar12 + -0x17] = L'\xffffffff';
                  }
                  lVar12 = lVar12 + 1;
                  lVar18 = lVar18 + 0x49;
                  iVar11 = iVar11 + -1;
                } while (iVar11 != 0);
              }
            }
          }
          else {
            if (wVar3 != L'-') goto switchD_0010d8a9_caseD_104;
            if (L'\0' < icount) {
              memset(gw[1].win,0,uVar23 * 4);
            }
          }
        }
      }
      else {
        switch(wVar3) {
        case L':':
          curses_getline("Search:",sbuf);
          if (L'\0' < icount) {
            p_Var6 = gw[1].resize;
            uVar9 = 0;
            do {
              pcVar7 = strstr((char *)p_Var6,sbuf);
              pnVar21 = local_218;
              if (pcVar7 != (char *)0x0) {
                iVar11 = *(int *)&gw[1].prev - *(int *)&gw[2].win;
                if (iVar11 < 1) {
                  iVar11 = 0;
                }
                if ((int)uVar9 < iVar11) {
                  iVar11 = (int)uVar9;
                }
                *(int *)&gw[2].draw = iVar11;
                break;
              }
              uVar9 = uVar9 + 1;
              p_Var6 = p_Var6 + 0x124;
            } while (uVar23 != uVar9);
          }
          break;
        case L';':
        case L'=':
        case L'?':
          goto switchD_0010d8a9_caseD_104;
        case L'<':
switchD_0010d926_caseD_3c:
          iVar11 = *(int *)&gw[2].draw;
LAB_0010da6c:
          iVar11 = iVar11 - *(int *)&gw[2].win;
          if (iVar11 < 1) {
            iVar11 = 0;
          }
          goto LAB_0010da76;
        case L'>':
switchD_0010d926_caseD_3e:
          iVar11 = *(int *)&gw[2].draw;
          iVar15 = *(int *)&gw[1].prev - *(int *)&gw[2].win;
          iVar10 = *(int *)&gw[2].win + iVar11;
          if (iVar15 <= iVar10) {
            iVar10 = iVar15;
          }
          *(int *)&gw[2].draw = iVar10;
          if ((wVar3 == L' ') && (bVar1 = bVar2, iVar11 == iVar10)) {
            bVar1 = true;
            bVar2 = bVar1;
          }
          break;
        case L'@':
          if (*(int *)((long)&gw[1].prev + 4) == 2 && L'\0' < icount) {
            pcVar16 = gw[1].resize + 0x110;
            uVar9 = 0;
            do {
              if (*(int *)pcVar16 != -1) {
                ((gw[1].win)->_bkgrnd).chars[uVar9 - 0x17] =
                     -(uint)(((gw[1].win)->_bkgrnd).chars[uVar9 - 0x17] == L'\0');
              }
              uVar9 = uVar9 + 1;
              pcVar16 = pcVar16 + 0x124;
            } while (uVar23 != uVar9);
          }
          break;
        default:
          if (wVar3 == L'.') {
            if (*(int *)((long)&gw[1].prev + 4) == 2 && L'\0' < icount) {
              pcVar16 = gw[1].resize + 0x110;
              uVar9 = 0;
              do {
                if (*(int *)pcVar16 != -1) {
                  ((gw[1].win)->_bkgrnd).chars[uVar9 - 0x17] = L'\xffffffff';
                }
                uVar9 = uVar9 + 1;
                pcVar16 = pcVar16 + 0x124;
              } while (uVar23 != uVar9);
            }
          }
          else {
            if (wVar3 != L'\\') goto switchD_0010d8a9_caseD_104;
            wVar3 = *(wchar_t *)&gw[2].draw;
            lVar12 = (long)wVar3;
            if (wVar3 < icount) {
              lVar18 = lVar12 * 0x49 + 0x44;
              iVar11 = icount - wVar3;
              do {
                if ((long)*(int *)&gw[2].win + (long)*(int *)&gw[2].draw <= lVar12) break;
                if (*(int *)(gw[1].resize + lVar18 * 4) != -1) {
                  ((gw[1].win)->_bkgrnd).chars[lVar12 + -0x17] = L'\0';
                }
                lVar12 = lVar12 + 1;
                lVar18 = lVar18 + 0x49;
                iVar11 = iVar11 + -1;
              } while (iVar11 != 0);
            }
          }
        }
      }
    }
    else {
      if (wVar3 < L'Ă') {
        if (wVar3 < L'~') {
          if (wVar3 == L'^') goto switchD_0010d8a9_caseD_106;
          if (wVar3 == L'|') {
LAB_0010da68:
            iVar11 = *(int *)&gw[1].prev;
            goto LAB_0010da6c;
          }
        }
        else {
          if (wVar3 == L'~') {
            if (*(int *)((long)&gw[1].prev + 4) == 2) {
              wVar3 = *(wchar_t *)&gw[2].draw;
              lVar12 = (long)wVar3;
              if (wVar3 < icount) {
                lVar18 = lVar12 * 0x49 + 0x44;
                iVar11 = icount - wVar3;
                do {
                  if ((long)*(int *)&gw[2].win + (long)*(int *)&gw[2].draw <= lVar12) break;
                  if (*(int *)(gw[1].resize + lVar18 * 4) != -1) {
                    ((gw[1].win)->_bkgrnd).chars[lVar12 + -0x17] =
                         -(uint)(((gw[1].win)->_bkgrnd).chars[lVar12 + -0x17] == L'\0');
                  }
                  lVar12 = lVar12 + 1;
                  lVar18 = lVar18 + 0x49;
                  iVar11 = iVar11 + -1;
                } while (iVar11 != 0);
              }
            }
            goto LAB_0010e040;
          }
          if (wVar3 == L'\x7f') goto switchD_0010d8a9_caseD_107;
        }
      }
      else {
        if (wVar3 < L'Œ') {
          switch(wVar3) {
          case L'Ă':
            if (*(int *)&gw[2].draw < *(int *)&gw[1].prev - *(int *)&gw[2].win) {
              iVar11 = *(int *)&gw[2].draw + 1;
LAB_0010da76:
              *(int *)&gw[2].draw = iVar11;
            }
            break;
          case L'ă':
            if (0 < *(int *)&gw[2].draw) {
              iVar11 = *(int *)&gw[2].draw + -1;
              goto LAB_0010da76;
            }
            break;
          default:
            goto switchD_0010d8a9_caseD_104;
          case L'Ć':
switchD_0010d8a9_caseD_106:
            *(undefined4 *)&gw[2].draw = 0;
            break;
          case L'ć':
switchD_0010d8a9_caseD_107:
            iVar11 = *(int *)((long)&gw[2].draw + 4);
            iVar10 = iVar11 / 10;
            if (iVar11 + 9U < 0x13) {
              iVar10 = -1;
            }
            *(int *)((long)&gw[2].draw + 4) = iVar10;
          }
          goto LAB_0010e040;
        }
        if (wVar3 < L'ŗ') {
          if (wVar3 == L'Œ') goto switchD_0010d926_caseD_3e;
          if (wVar3 == L'œ') goto switchD_0010d926_caseD_3c;
        }
        else {
          if (wVar3 == L'ŗ') goto LAB_0010e03d;
          if (wVar3 == L'Ũ') goto LAB_0010da68;
        }
      }
switchD_0010d8a9_caseD_104:
      if ((uint)(wVar3 + L'\xffffffd0') < 10) {
        if (*(int *)((long)&gw[2].draw + 4) == -1) {
          *(undefined4 *)((long)&gw[2].draw + 4) = 0;
        }
        uVar4 = wVar3 + L'\xffffffd0' + *(int *)((long)&gw[2].draw + 4) * 10;
        *(uint *)((long)&gw[2].draw + 4) = uVar4;
        if (0xffff < (int)uVar4) {
          *(uint *)((long)&gw[2].draw + 4) = uVar4 / 10;
        }
      }
      else {
        uVar4 = *(uint *)&gw[1].prev;
        uVar8 = *(uint *)&gw[2].draw;
        uVar17 = *(int *)&gw[2].win + uVar8;
        if ((int)uVar4 < (int)uVar17) {
          uVar17 = uVar4;
        }
        if ((int)uVar8 < (int)uVar17) {
          p_Var6 = gw[1].resize + (long)(int)uVar8 * 0x124 + 0x120;
          do {
            if (wVar3 == (char)*p_Var6) goto LAB_0010dd59;
            uVar8 = uVar8 + 1;
            p_Var6 = p_Var6 + 0x124;
          } while (uVar17 != uVar8);
        }
        uVar8 = 0xffffffff;
        if (0 < (int)uVar4 && *(int *)&gw[2].win < (int)uVar4) {
          pcVar16 = gw[1].resize + 0x120;
          uVar9 = 0;
          do {
            if (wVar3 == (char)*pcVar16) {
              uVar8 = (uint)uVar9;
              break;
            }
            uVar9 = uVar9 + 1;
            pcVar16 = pcVar16 + 0x124;
          } while (uVar4 != uVar9);
        }
LAB_0010dd59:
        if (uVar8 == 0xffffffff) {
          if ((*(int *)((long)&gw[1].prev + 4) == 2) && (0 < *(int *)&gw[1].prev)) {
            lVar12 = 0;
            lVar18 = 0;
            iVar11 = 0;
            do {
              if ((wVar3 == (&pnVar21->group_accel)[lVar12]) &&
                 (p_Var6 = gw[1].resize, *(int *)(p_Var6 + lVar12 + 0x110) != -1)) {
                wVar19 = *(wchar_t *)((long)&gw[2].draw + 4);
                if (wVar19 < L'\x01') {
                  wVar19 = -(uint)(((gw[1].win)->_bkgrnd).chars[lVar18 + -0x17] == L'\0');
                }
                ((gw[1].win)->_bkgrnd).chars[lVar18 + -0x17] = wVar19;
                if (*(wchar_t *)(p_Var6 + lVar12 + 0x108) <=
                    ((gw[1].win)->_bkgrnd).chars[lVar18 + -0x17]) {
                  ((gw[1].win)->_bkgrnd).chars[lVar18 + -0x17] = L'\xffffffff';
                }
                iVar11 = iVar11 + 1;
              }
              lVar18 = lVar18 + 1;
              lVar12 = lVar12 + 0x124;
            } while (lVar18 < *(int *)&gw[1].prev);
            if (iVar11 != 0) {
              *(undefined4 *)((long)&gw[2].draw + 4) = 0xffffffff;
            }
          }
        }
        else {
          wVar3 = *(wchar_t *)((long)&gw[2].draw + 4);
          lVar12 = (long)(int)uVar8;
          if (wVar3 < L'\x01') {
            wVar3 = -(uint)(((gw[1].win)->_bkgrnd).chars[lVar12 + -0x17] == L'\0');
          }
          ((gw[1].win)->_bkgrnd).chars[lVar12 + -0x17] = wVar3;
          p_Var6 = gw[1].resize;
          lVar18 = lVar12 * 0x124;
          if (*(wchar_t *)(p_Var6 + lVar18 + 0x108) <= ((gw[1].win)->_bkgrnd).chars[lVar12 + -0x17])
          {
            ((gw[1].win)->_bkgrnd).chars[lVar12 + -0x17] = L'\xffffffff';
          }
          *(undefined4 *)((long)&gw[2].draw + 4) = 0xffffffff;
          iVar11 = *(int *)((long)&gw[1].prev + 4);
          if (iVar11 == 1) {
LAB_0010e03d:
            bVar1 = true;
            bVar2 = true;
          }
          else if (iVar11 == -1) {
            ccount = L'\0';
            lVar12 = nh_get_object_commands(&ccount);
            wVar3 = ccount;
            if (ccount != L'\0' && lVar12 != 0) {
              lVar20 = (long)ccount;
              local_200 = lVar12;
              local_210 = (nh_menuitem_conflict *)malloc(lVar20 * 0x10c);
              if (L'\0' < wVar3) {
                local_208 = local_200 + 0x14;
                pnVar13 = &local_210->selected;
                wVar3 = L'\x01';
                lVar12 = 0;
                do {
                  ((nh_menuitem_conflict *)(pnVar13 + -0x10a))->id = wVar3;
                  *(nh_menuitem_role *)(pnVar13 + -0x106) = MI_NORMAL;
                  pnVar13[-2] = *(char *)(local_200 + 100 + lVar12);
                  *(undefined2 *)(pnVar13 + -1) = 0;
                  strcpy(pnVar13 + -0x102,(char *)(local_208 + lVar12));
                  lVar12 = lVar12 + 0x6c;
                  wVar3 = wVar3 + L'\x01';
                  pnVar13 = pnVar13 + 0x10c;
                } while (lVar20 * 0x6c != lVar12);
              }
              if ((settings.invweight == '\0') || (*(int *)(p_Var6 + lVar18 + 0x118) == -1)) {
                snprintf(title_1,0x80,"%c - %s",(ulong)(uint)(int)(char)p_Var6[lVar18 + 0x120]);
              }
              else {
                snprintf(title_1,0x80,"%c - %s {%d}",(ulong)(uint)(int)(char)p_Var6[lVar18 + 0x120])
                ;
              }
              pnVar21 = local_218;
              wVar3 = curses_display_menu_core
                                (local_210,ccount,title_1,L'\x01',selected,L'\0',L'\0',L'\xffffffff'
                                 ,L'\xffffffff',(_func_nh_bool_win_menu_ptr_wchar_t *)0x0,'\0');
              local_208 = CONCAT44(local_208._4_4_,wVar3);
              free(local_210);
              if (0 < (int)local_208) {
                cVar14 = *(char *)(local_200 + -7 + (long)selected[0] * 0x6c);
                if (cVar14 == '\0') {
                  local_1ec.argtype = 2;
                }
                else {
                  local_1ec.argtype = 0x10;
                  local_1ec.field_1.invlet = cVar14;
                }
                set_next_command((char *)(local_200 + (long)selected[0] * 0x6c + -0x6c),&local_1ec);
                goto LAB_0010e03d;
              }
            }
          }
        }
      }
    }
LAB_0010e040:
    if (bVar1 || (char)local_1f8 != '\0') {
      delwin(gw[1].draw);
      delwin(gw->win);
      wVar3 = L'\xffffffff';
      if ((char)local_1f8 == '\0') {
        if (icount < L'\x01') {
          wVar3 = L'\0';
        }
        else {
          pWVar5 = gw[1].win;
          pwVar22 = &pnVar21->id;
          uVar9 = 0;
          wVar3 = L'\0';
          do {
            if ((pWVar5->_bkgrnd).chars[uVar9 - 0x17] != L'\0') {
              if (results != (nh_objresult_conflict *)0x0) {
                results[wVar3].id = *pwVar22;
                results[wVar3].count = (pWVar5->_bkgrnd).chars[uVar9 - 0x17];
              }
              wVar3 = wVar3 + L'\x01';
            }
            uVar9 = uVar9 + 1;
            pwVar22 = pwVar22 + 0x49;
          } while (uVar23 != uVar9);
        }
      }
      free(gw[1].win);
      delete_gamewin(gw);
      redraw_game_windows();
      curs_set(local_1f0);
      return wVar3;
    }
  } while( true );
}

Assistant:

int curses_display_objects(struct nh_objitem *items, int icount,
		  const char *title, int how, struct nh_objresult *results)
{
    struct gamewin *gw;
    struct win_objmenu *mdat;
    int i, key, idx, rv, startx, starty, prevcurs, prev_offset;
    nh_bool done, cancelled;
    char sbuf[BUFSZ];
    
    prevcurs = curs_set(0);
    
    gw = alloc_gamewin(sizeof(struct win_objmenu));
    gw->draw = draw_objmenu;
    gw->resize = resize_objmenu;
    mdat = (struct win_objmenu*)gw->extra;
    mdat->items = items;
    mdat->icount = icount;
    mdat->title = title;
    mdat->how = how;
    mdat->selcount = -1;
    mdat->selected = calloc(icount, sizeof(int));
    
    if (how != PICK_NONE && how != PICK_INVACTION)
	assign_objmenu_accelerators(mdat);
    layout_objmenu(gw);
    
    starty = (LINES - mdat->height) / 2;
    startx = (COLS - mdat->width) / 2;
    
    gw->win = newwin(mdat->height, mdat->width, starty, startx);
    keypad(gw->win, TRUE);
    nh_box_wborder(gw->win, FRAME_ATTRS);
    mdat->content = derwin(gw->win, mdat->innerheight, mdat->innerwidth,
			   mdat->frameheight-1, 2);
    leaveok(gw->win, TRUE);
    leaveok(mdat->content, TRUE);
    
    done = FALSE;
    cancelled = FALSE;
    while (!done && !cancelled) {
	draw_objmenu(gw);
	
	key = nh_wgetch(gw->win);
	
	switch (key) {
	    /* one line up */
	    case KEY_UP:
		if (mdat->offset > 0)
		    mdat->offset--;
		break;
		
	    /* one line down */
	    case KEY_DOWN:
		if (mdat->offset < mdat->icount - mdat->innerheight)
		    mdat->offset++;
		break;
	    
	    /* page up */
	    case KEY_PPAGE:
	    case '<':
		mdat->offset -= mdat->innerheight;
		if (mdat->offset < 0)
		    mdat->offset = 0;
		break;
	    
	    /* page down */
	    case KEY_NPAGE:
	    case '>':
	    case ' ':
		prev_offset = mdat->offset;
		mdat->offset += mdat->innerheight;
		if (mdat->offset > mdat->icount - mdat->innerheight)
		    mdat->offset = mdat->icount - mdat->innerheight;
		if (key == ' ' && prev_offset == mdat->offset)
		    done = TRUE;
		break;
		
	    /* go to the top */
	    case KEY_HOME:
	    case '^':
		mdat->offset = 0;
		break;
		
	    /* go to the end */
	    case KEY_END:
	    case '|':
		mdat->offset = max(mdat->icount - mdat->innerheight, 0);
		break;
		
	    /* cancel */
	    case KEY_ESC:
		cancelled = TRUE;
		break;
		
	    /* confirm */
	    case KEY_ENTER:
	    case '\r':
		done = TRUE;
		break;
		
	    /* select all */
	    case '.':
		if (mdat->how == PICK_ANY)
		    for (i = 0; i < icount; i++)
			if (mdat->items[i].oclass != -1)
			    mdat->selected[i] = -1;
		break;
		
	    /* select none */
	    case '-':
		for (i = 0; i < icount; i++)
		    mdat->selected[i] = 0;
		break;
		
	    /* invert all */
	    case '@':
		if (mdat->how == PICK_ANY)
		    for (i = 0; i < icount; i++)
			if (mdat->items[i].oclass != -1)
			    mdat->selected[i] = mdat->selected[i] ? 0 : -1;
		break;
		
	    /* select page */
	    case ',':
		if (mdat->how != PICK_ANY)
		    break;
		
		for (i = mdat->offset;
		     i < icount && i < mdat->offset + mdat->innerheight; i++)
		    if (mdat->items[i].oclass != -1)
			mdat->selected[i] = -1;
		break;
		
	    /* deselect page */
	    case '\\':
		for (i = mdat->offset;
		     i < icount && i < mdat->offset + mdat->innerheight; i++)
		    if (mdat->items[i].oclass != -1)
			mdat->selected[i] = 0;
		break;
		
	    /* invert page */
	    case '~':
		if (mdat->how != PICK_ANY)
		    break;
		
		for (i = mdat->offset;
		     i < icount && i < mdat->offset + mdat->innerheight; i++)
		    if (mdat->items[i].oclass != -1)
			mdat->selected[i] = mdat->selected[i] ? 0 : -1;
		break;
		
	    /* search for a menu item */
	    case ':':
		curses_getline("Search:", sbuf);
		for (i = 0; i < icount; i++)
		    if (strstr(mdat->items[i].caption, sbuf))
			break;
		if (i < icount) {
		    int end = max(mdat->icount - mdat->innerheight, 0);
		    mdat->offset = min(i, end);
		}
		break;
		
	    /* edit selection count */
	    case KEY_BACKSPACE:
	    case KEY_BACKDEL:
		mdat->selcount /= 10;
		if (mdat->selcount == 0)
		    mdat->selcount = -1; /* -1: select all */
		break;
		
	    default:
		/* selection allows an item count */
		if (key >= '0' && key <= '9') {
		    if (mdat->selcount == -1)
			mdat->selcount = 0;
		    mdat->selcount = mdat->selcount * 10 + (key - '0');
		    if (mdat->selcount > 0xffff)
			mdat->selcount /= 10;
		    
		    break;
		}
		
		/* try to find an item for this key and, if one is found, select it */
		idx = find_objaccel(key, mdat);
		
		if (idx != -1) { /* valid item accelerator */
		    if (mdat->selcount > 0)
			mdat->selected[idx] = mdat->selcount;
		    else
			mdat->selected[idx] = mdat->selected[idx] ? 0 : -1;
		    if (mdat->selected[idx] >= mdat->items[idx].count)
			mdat->selected[idx] = -1;
		    mdat->selcount = -1;
		    
		    if (mdat->how == PICK_ONE)
			done = TRUE;
		    
		    /* show item actions menu */
		    else if (mdat->how == PICK_INVACTION)
			if (do_item_actions(&mdat->items[idx]))
			    done = TRUE;
		    
		} else if (mdat->how == PICK_ANY) { /* maybe it's a group accel? */
		    int grouphits = 0;
		    for (i = 0; i < mdat->icount; i++) {
			if (items[i].group_accel == key && mdat->items[i].oclass != -1) {
			    if (mdat->selcount > 0)
				mdat->selected[i] = mdat->selcount;
			    else
				mdat->selected[i] = mdat->selected[i] ? 0 : -1;
			    if (mdat->selected[i] >= mdat->items[i].count)
				mdat->selected[i] = -1;
			    grouphits++;
			}
		    }
		    
		    if (grouphits)
			mdat->selcount = -1;
		}
		break;
	}
    }
    
    delwin(mdat->content);
    delwin(gw->win);
    
    if (cancelled)
	rv = -1;
    else {
	rv = 0;
	for (i = 0; i < icount; i++) {
	    if (mdat->selected[i]) {
		if (results) {
		    results[rv].id = items[i].id;
		    results[rv].count = mdat->selected[i];
		}
		rv++;
	    }
	}
    }
    
    free(mdat->selected);
    delete_gamewin(gw);
    redraw_game_windows();
    curs_set(prevcurs);
	
    return rv;
}